

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FontProvider.cpp
# Opt level: O3

bool Rml::FontProvider::Initialise(void)

{
  code *pcVar1;
  bool bVar2;
  FontProvider *this;
  
  if (g_font_provider != (FontProvider *)0x0) {
    bVar2 = Assert("RMLUI_ASSERT(!g_font_provider)",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/FontEngineDefault/FontProvider.cpp"
                   ,0x39);
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  bVar2 = FreeType::Initialise();
  if (bVar2) {
    this = (FontProvider *)operator_new(0x48);
    FontProvider(this);
    g_font_provider = this;
  }
  return bVar2;
}

Assistant:

bool FontProvider::Initialise()
{
	RMLUI_ASSERT(!g_font_provider);
	if (!FreeType::Initialise())
		return false;
	g_font_provider = new FontProvider;
	return true;
}